

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_io_SockAddrParser.cpp
# Opt level: O1

bool __thiscall axl::io::SockAddrParser::tryAddr_ip4(SockAddrParser *this)

{
  char *pcVar1;
  bool bVar2;
  bool bVar3;
  long lVar4;
  
  bVar2 = tryInt(this,10);
  if (bVar2) {
    lVar4 = 4;
    while( true ) {
      lVar4 = lVar4 + -1;
      bVar2 = lVar4 == 0;
      if (bVar2) break;
      skipWhiteSpace(this);
      pcVar1 = this->m_p;
      if (this->m_end <= pcVar1) {
        return bVar2;
      }
      if (*pcVar1 != '.') {
        return bVar2;
      }
      this->m_p = pcVar1 + 1;
      bVar3 = tryInt(this,10);
      if (!bVar3) {
        return bVar2;
      }
    }
  }
  else {
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool
SockAddrParser::tryAddr_ip4() {
	bool result;

	for (size_t i = 0;; i++) {
		result = tryInt(10);
		if (!result)
			return false;

		if (i >= 3)
			break;

		result = tryChar('.');
		if (!result)
			return false;
	}

	return true;
}